

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rom.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_32777e::Nrom_write_and_read_byte_cpu_bus_32k_prg_rom_Test::
Nrom_write_and_read_byte_cpu_bus_32k_prg_rom_Test
          (Nrom_write_and_read_byte_cpu_bus_32k_prg_rom_Test *this)

{
  Nrom_write_and_read_byte_cpu_bus_32k_prg_rom_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__Nrom_write_and_read_byte_cpu_bus_32k_prg_rom_Test_003fb3a0;
  return;
}

Assistant:

TEST(Nrom, write_and_read_byte_cpu_bus_32k_prg_rom) {
    constexpr int kPrgRomBanks = 2;
    std::string bytes{nrom_bytes(kPrgRomBanks, 1, Mapper::Nrom)};
    set_prg_rom_byte(2, &bytes, 0x0000, 0xAB); // Mapped to 0x8000
    set_prg_rom_byte(2, &bytes, 0x3FFF, 0x10); // Mapped to 0xBFFF
    set_prg_rom_byte(2, &bytes, 0x4000, 0x42); // Mapped to 0xC000
    set_prg_rom_byte(2, &bytes, 0x7FFF, 0x78); // Mapped to 0xFFFF

    std::stringstream ss(bytes);
    std::unique_ptr<IRom> nrom = RomFactory::from_bytes(ss);

    // 32 K prg rom:
    // CPU $8000-$BFFF: First 16 KB of ROM.
    // CPU $C000-$FFFF: Last 16 KB of ROM.
    EXPECT_EQ(0xAB, nrom->cpu_read_byte(0x8000));
    EXPECT_EQ(0x10, nrom->cpu_read_byte(0xBFFF));
    EXPECT_EQ(0x42, nrom->cpu_read_byte(0xC000));
    EXPECT_EQ(0x78, nrom->cpu_read_byte(0xFFFF));
}